

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

bool __thiscall wabt::WastLexer::MatchString(WastLexer *this,string_view s)

{
  char cVar1;
  byte *pbVar2;
  size_type sVar3;
  size_type sVar4;
  uint uVar5;
  byte *pbVar6;
  
  pbVar2 = (byte *)this->cursor_;
  sVar3 = 0;
  pbVar6 = pbVar2;
  do {
    sVar4 = sVar3;
    if (s.size_ == sVar4) goto LAB_0015ee4e;
    cVar1 = s.data_[sVar4];
    if (pbVar6 < this->buffer_end_) {
      this->cursor_ = (char *)(pbVar6 + 1);
      uVar5 = (uint)*pbVar6;
      pbVar6 = pbVar6 + 1;
    }
    else {
      uVar5 = 0xffffffff;
    }
    sVar3 = sVar4 + 1;
  } while (uVar5 == (int)cVar1);
  this->cursor_ = (char *)pbVar2;
LAB_0015ee4e:
  return s.size_ == sVar4;
}

Assistant:

bool WastLexer::MatchString(string_view s) {
  const char* saved_cursor = cursor_;
  for (char c : s) {
    if (ReadChar() != c) {
      cursor_ = saved_cursor;
      return false;
    }
  }
  return true;
}